

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

TypeDescriptor * addOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  types *ptVar1;
  NumberDescriptor *this;
  StringDescriptor *this_00;
  double dVar2;
  double dVar3;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  StringDescriptor *stringSum;
  NumberDescriptor *numSum;
  TypeDescriptor *rightValue_local;
  TypeDescriptor *leftValue_local;
  
  numSum = (NumberDescriptor *)rightValue;
  rightValue_local = leftValue;
  ptVar1 = TypeDescriptor::type(leftValue);
  if (*ptVar1 == NUMBER) {
    this = (NumberDescriptor *)operator_new(0x60);
    dVar2 = TypeDescriptor::getNumber(rightValue_local);
    dVar3 = TypeDescriptor::getNumber(&numSum->super_TypeDescriptor);
    NumberDescriptor::NumberDescriptor(this,dVar2 + dVar3);
    leftValue_local = (TypeDescriptor *)this;
  }
  else {
    this_00 = (StringDescriptor *)operator_new(0x78);
    TypeDescriptor::getString_abi_cxx11_(&local_80,rightValue_local);
    TypeDescriptor::getString_abi_cxx11_(&local_a0,&numSum->super_TypeDescriptor);
    std::operator+(&local_60,&local_80,&local_a0);
    StringDescriptor::StringDescriptor(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    leftValue_local = (TypeDescriptor *)this_00;
  }
  return leftValue_local;
}

Assistant:

TypeDescriptor *addOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER){
        auto *numSum = new  NumberDescriptor(leftValue->getNumber() + rightValue->getNumber());
        //std::cout << "TypeDescriptor* addOperator: " << leftValue->getNumber() << " + " << rightValue->getNumber() << std::endl;
        return numSum;
    }else if(leftValue->STRING){

        auto *stringSum = new StringDescriptor( leftValue->getString()  + rightValue->getString() );
        return stringSum;
    }else{
        std::cout << "Unknown type. Terminating" << std::endl;
        exit(2);
    }
}